

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O1

void __thiscall
OpenMD::SelectionEvaluator::compareProperty
          (SelectionEvaluator *this,StuntDouble *sd,SelectionSet *bs,int property,int comparator,
          float comparisonValue,int frame)

{
  double *pdVar1;
  ulong *puVar2;
  SnapshotManager *pSVar3;
  RealType RVar4;
  double dVar5;
  double dVar6;
  uint i;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  long lVar8;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  ulong uVar9;
  ulong uVar10;
  Atom *atom;
  Atom *atom_00;
  _func_int **pp_Var11;
  bool bVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  Vector3d pos;
  Vector3d local_78;
  undefined1 local_58 [16];
  double local_48 [3];
  
  local_78.super_Vector<double,_3U>.data_[0] = 0.0;
  local_78.super_Vector<double,_3U>.data_[1] = 0.0;
  local_78.super_Vector<double,_3U>.data_[2] = 0.0;
  switch(property) {
  case 0x1c00:
    dVar5 = sd->mass_;
    break;
  case 0x1c01:
    if (sd->objType_ < otRigidBody) {
      RVar4 = getCharge(this,(Atom *)sd,frame);
      uVar13 = SUB84(RVar4,0);
      uVar14 = (undefined4)((ulong)RVar4 >> 0x20);
LAB_00262cfa:
      dVar5 = (double)CONCAT44(uVar14,uVar13);
    }
    else {
      dVar5 = 0.0;
      uVar13 = 0;
      uVar14 = 0;
      if (sd->objType_ == otRigidBody) {
        pp_Var11 = (_func_int **)sd[2].mass_;
        dVar5 = 0.0;
        if (pp_Var11 == sd[2].properties_._vptr_PropertyMap) {
          atom_00 = (Atom *)0x0;
        }
        else {
          atom_00 = (Atom *)*pp_Var11;
        }
        while (atom_00 != (Atom *)0x0) {
          pp_Var11 = pp_Var11 + 1;
          local_58._8_4_ = uVar13;
          local_58._0_8_ = dVar5;
          local_58._12_4_ = uVar14;
          RVar4 = getCharge(this,atom_00,frame);
          if (pp_Var11 == sd[2].properties_._vptr_PropertyMap) {
            atom_00 = (Atom *)0x0;
          }
          else {
            atom_00 = (Atom *)*pp_Var11;
          }
          uVar13 = local_58._8_4_;
          uVar14 = local_58._12_4_;
          dVar5 = local_58._0_8_ + RVar4;
        }
      }
    }
    break;
  case 0x1c02:
    iVar7 = (*sd->snapshotMan_->_vptr_SnapshotManager[4])(sd->snapshotMan_,(ulong)(uint)frame);
    dVar5 = *(double *)
             (*(long *)(CONCAT44(extraout_var_00,iVar7) + sd->storage_) +
             (long)sd->localIndex_ * 0x18);
    break;
  case 0x1c03:
    iVar7 = (*sd->snapshotMan_->_vptr_SnapshotManager[4])(sd->snapshotMan_,(ulong)(uint)frame);
    dVar5 = *(double *)
             (*(long *)(CONCAT44(extraout_var_01,iVar7) + sd->storage_) + 8 +
             (long)sd->localIndex_ * 0x18);
    break;
  case 0x1c04:
    iVar7 = (*sd->snapshotMan_->_vptr_SnapshotManager[4])(sd->snapshotMan_,(ulong)(uint)frame);
    dVar5 = *(double *)
             (*(long *)(CONCAT44(extraout_var,iVar7) + sd->storage_) + 0x10 +
             (long)sd->localIndex_ * 0x18);
    break;
  case 0x1c05:
    iVar7 = (*sd->snapshotMan_->_vptr_SnapshotManager[4])(sd->snapshotMan_,(ulong)(uint)frame);
    lVar8 = *(long *)(CONCAT44(extraout_var_04,iVar7) + sd->storage_);
    pdVar1 = (double *)(lVar8 + (long)sd->localIndex_ * 0x18);
    local_48[0] = *pdVar1;
    local_48[1] = pdVar1[1];
    local_48[2] = (double)*(undefined8 *)(lVar8 + 0x10 + (long)sd->localIndex_ * 0x18);
    dVar5 = 0.0;
    lVar8 = 0;
    do {
      dVar5 = dVar5 + local_48[lVar8] * local_48[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
      uVar13 = SUB84(dVar5,0);
      uVar14 = (undefined4)((ulong)dVar5 >> 0x20);
      goto LAB_00262cfa;
    }
    dVar5 = SQRT(dVar5);
    break;
  case 0x1c06:
    iVar7 = (*sd->snapshotMan_->_vptr_SnapshotManager[4])(sd->snapshotMan_,(ulong)(uint)frame);
    lVar8 = *(long *)(CONCAT44(extraout_var_05,iVar7) + sd->storage_);
    local_78.super_Vector<double,_3U>.data_[2] =
         *(double *)(lVar8 + 0x10 + (long)sd->localIndex_ * 0x18);
    pdVar1 = (double *)(lVar8 + (long)sd->localIndex_ * 0x18);
    local_78.super_Vector<double,_3U>.data_[0] = *pdVar1;
    local_78.super_Vector<double,_3U>.data_[1] = pdVar1[1];
    pSVar3 = this->info->sman_;
    iVar7 = (*pSVar3->_vptr_SnapshotManager[4])(pSVar3,(ulong)(uint)frame);
    Snapshot::wrapVector((Snapshot *)CONCAT44(extraout_var_06,iVar7),&local_78);
    dVar5 = local_78.super_Vector<double,_3U>.data_[0];
    break;
  case 0x1c07:
    iVar7 = (*sd->snapshotMan_->_vptr_SnapshotManager[4])(sd->snapshotMan_,(ulong)(uint)frame);
    lVar8 = *(long *)(CONCAT44(extraout_var_02,iVar7) + sd->storage_);
    local_78.super_Vector<double,_3U>.data_[2] =
         *(double *)(lVar8 + 0x10 + (long)sd->localIndex_ * 0x18);
    pdVar1 = (double *)(lVar8 + (long)sd->localIndex_ * 0x18);
    local_78.super_Vector<double,_3U>.data_[0] = *pdVar1;
    local_78.super_Vector<double,_3U>.data_[1] = pdVar1[1];
    pSVar3 = this->info->sman_;
    iVar7 = (*pSVar3->_vptr_SnapshotManager[4])(pSVar3,(ulong)(uint)frame);
    Snapshot::wrapVector((Snapshot *)CONCAT44(extraout_var_03,iVar7),&local_78);
    dVar5 = local_78.super_Vector<double,_3U>.data_[1];
    break;
  case 0x1c08:
    iVar7 = (*sd->snapshotMan_->_vptr_SnapshotManager[4])(sd->snapshotMan_,(ulong)(uint)frame);
    lVar8 = *(long *)(CONCAT44(extraout_var_07,iVar7) + sd->storage_);
    local_78.super_Vector<double,_3U>.data_[2] =
         *(double *)(lVar8 + 0x10 + (long)sd->localIndex_ * 0x18);
    pdVar1 = (double *)(lVar8 + (long)sd->localIndex_ * 0x18);
    local_78.super_Vector<double,_3U>.data_[0] = *pdVar1;
    local_78.super_Vector<double,_3U>.data_[1] = pdVar1[1];
    pSVar3 = this->info->sman_;
    iVar7 = (*pSVar3->_vptr_SnapshotManager[4])(pSVar3,(ulong)(uint)frame);
    Snapshot::wrapVector((Snapshot *)CONCAT44(extraout_var_08,iVar7),&local_78);
    dVar5 = local_78.super_Vector<double,_3U>.data_[2];
    break;
  case 0x1c09:
    dVar5 = 0.0;
    if (sd->objType_ < otRigidBody) {
      dVar5 = (double)sd->globalIndex_;
    }
    break;
  default:
    unrecognizedAtomProperty(this,property);
    dVar5 = 0.0;
  }
  switch(comparator) {
  case 0x3400:
    bVar12 = dVar5 < (double)comparisonValue;
    break;
  case 0x3401:
    bVar12 = dVar5 < (double)comparisonValue;
    goto LAB_00262d7b;
  case 0x3402:
    dVar6 = (double)comparisonValue;
    goto LAB_00262d56;
  case 0x3403:
    bVar12 = (double)comparisonValue < dVar5;
    break;
  case 0x3404:
    dVar5 = ABS(dVar5 - (double)comparisonValue);
    dVar6 = 1e-06;
LAB_00262d56:
    bVar12 = dVar6 < dVar5;
LAB_00262d7b:
    bVar12 = !bVar12;
    goto LAB_00262d96;
  case 0x3405:
    bVar12 = dVar5 != (double)comparisonValue;
    goto LAB_00262d96;
  default:
    goto switchD_00262d1d_default;
  }
  bVar12 = !bVar12 && (double)comparisonValue != dVar5;
LAB_00262d96:
  if (bVar12) {
    uVar9 = (ulong)sd->globalIndex_;
    uVar10 = uVar9 + 0x3f;
    if (-1 < (long)uVar9) {
      uVar10 = uVar9;
    }
    puVar2 = (ulong *)(((long)uVar10 >> 6) * 8 +
                       *(long *)&(((bs->bitsets_).
                                   super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                                 super__Bvector_base<std::allocator<bool>_> + -8 +
                      (ulong)((uVar9 & 0x800000000000003f) < 0x8000000000000001) * 8);
    *puVar2 = *puVar2 | 1L << ((byte)sd->globalIndex_ & 0x3f);
  }
switchD_00262d1d_default:
  return;
}

Assistant:

void SelectionEvaluator::compareProperty(StuntDouble* sd, SelectionSet& bs,
                                           int property, int comparator,
                                           float comparisonValue, int frame) {
    RealType propertyValue = 0.0;
    Vector3d pos;
    switch (property) {
    case Token::atomno:
      if (sd->isAtom()) {
        Atom* atom    = static_cast<Atom*>(sd);
        propertyValue = atom->getGlobalIndex();
      }
      break;
    case Token::mass:
      propertyValue = sd->getMass();
      break;
    case Token::charge:
      if (sd->isAtom()) {
        Atom* atom    = static_cast<Atom*>(sd);
        propertyValue = getCharge(atom, frame);
      } else if (sd->isRigidBody()) {
        RigidBody* rb = static_cast<RigidBody*>(sd);
        RigidBody::AtomIterator ai;
        Atom* atom;
        for (atom = rb->beginAtom(ai); atom != NULL; atom = rb->nextAtom(ai)) {
          propertyValue += getCharge(atom, frame);
        }
      }
      break;
    case Token::x:
      propertyValue = sd->getPos(frame).x();
      break;
    case Token::y:
      propertyValue = sd->getPos(frame).y();
      break;
    case Token::z:
      propertyValue = sd->getPos(frame).z();
      break;
    case Token::wrappedX:
      pos = sd->getPos(frame);
      info->getSnapshotManager()->getSnapshot(frame)->wrapVector(pos);
      propertyValue = pos.x();
      break;
    case Token::wrappedY:
      pos = sd->getPos(frame);
      info->getSnapshotManager()->getSnapshot(frame)->wrapVector(pos);
      propertyValue = pos.y();
      break;
    case Token::wrappedZ:
      pos = sd->getPos(frame);
      info->getSnapshotManager()->getSnapshot(frame)->wrapVector(pos);
      propertyValue = pos.z();
      break;

    case Token::r:
      propertyValue = sd->getPos(frame).length();
      break;
    default:
      unrecognizedAtomProperty(property);
    }

    bool match = false;
    switch (comparator) {
    case Token::opLT:
      match = propertyValue < comparisonValue;
      break;
    case Token::opLE:
      match = propertyValue <= comparisonValue;
      break;
    case Token::opGE:
      match = propertyValue >= comparisonValue;
      break;
    case Token::opGT:
      match = propertyValue > comparisonValue;
      break;
    case Token::opEQ:
      match = fabs(propertyValue - comparisonValue) <= OpenMD::epsilon;
      break;
    case Token::opNE:
      match = propertyValue != comparisonValue;
      break;
    }
    if (match) bs.bitsets_[STUNTDOUBLE].setBitOn(sd->getGlobalIndex());
  }